

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::ConstantSpectrum::ToString_abi_cxx11_(string *__return_storage_ptr__,ConstantSpectrum *this)

{
  float *in_RCX;
  
  StringPrintf<float_const&>
            (__return_storage_ptr__,(pbrt *)"[ ConstantSpectrum c: %f ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantSpectrum::ToString() const {
    return StringPrintf("[ ConstantSpectrum c: %f ]", c);
}